

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

Var Js::ProfilingHelpers::ProfiledLdFldForTypeOf_Jit
              (Var instance,PropertyId propertyId,InlineCacheIndex inlineCacheIndex,
              void *framePointer)

{
  JavascriptCallStackLayout *pJVar1;
  ScriptFunction *scriptFunction_00;
  InlineCache *inlineCache;
  FunctionBody *functionBody;
  Var pvVar2;
  ScriptFunction *scriptFunction;
  void *framePointer_local;
  InlineCacheIndex inlineCacheIndex_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  pJVar1 = JavascriptCallStackLayout::FromFramePointer(framePointer);
  scriptFunction_00 =
       UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)pJVar1);
  inlineCache = GetInlineCache(scriptFunction_00,inlineCacheIndex);
  functionBody = JavascriptFunction::GetFunctionBody((JavascriptFunction *)scriptFunction_00);
  pvVar2 = ProfiledLdFldForTypeOf<false,false,false>
                     (instance,propertyId,inlineCache,inlineCacheIndex,functionBody);
  return pvVar2;
}

Assistant:

Var ProfilingHelpers::ProfiledLdFldForTypeOf_Jit(
        const Var instance,
        const PropertyId propertyId,
        const InlineCacheIndex inlineCacheIndex,
        void *const framePointer)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledLdFldForTypeOf);
        ScriptFunction *const scriptFunction =
            UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);

        return ProfiledLdFldForTypeOf<false, false, false>(
            instance,
            propertyId,
            GetInlineCache(scriptFunction, inlineCacheIndex),
            inlineCacheIndex,
            scriptFunction->GetFunctionBody());
        JIT_HELPER_END(ProfiledLdFldForTypeOf);
    }